

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O0

int __thiscall MIDIStreamer::ClampLoopCount(MIDIStreamer *this,int loopcount)

{
  int loopcount_local;
  MIDIStreamer *this_local;
  
  this_local._4_4_ = loopcount;
  if (this->LoopLimit != 0) {
    if (this->LoopLimit == 1) {
      this_local._4_4_ = 1;
    }
    else if (loopcount == 0) {
      this_local._4_4_ = this->LoopLimit;
    }
  }
  return this_local._4_4_;
}

Assistant:

int MIDIStreamer::ClampLoopCount(int loopcount)
{
	if (LoopLimit == 0)
	{
		return loopcount;
	}
	if (LoopLimit == 1)
	{
		return 1;
	}
	if (loopcount == 0)
	{
		return LoopLimit;
	}
	return loopcount;
}